

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JupiterAce.cpp
# Opt level: O1

bool IsDeepThoughtDisk(Disk *disk,Sector **sector)

{
  bool bVar1;
  int iVar2;
  Header local_30;
  
  iVar2 = SizeToCode(0x1000);
  Header::Header(&local_30,0,0,0,iVar2);
  bVar1 = Disk::find(disk,&local_30,sector);
  if (!bVar1) {
    iVar2 = SizeToCode(0x1000);
    Header::Header(&local_30,1,0,0,iVar2);
    bVar1 = Disk::find(disk,&local_30,sector);
    if (!bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool IsDeepThoughtDisk(Disk& disk, const Sector*& sector)
{
    // Try the primary catalogue location on cyl 0
    if (!disk.find(Header(0, 0, 0, SizeToCode(4096)), sector))
    {
        // Try the backup location on cyl 1
        if (!disk.find(Header(1, 0, 0, SizeToCode(4096)), sector))
            return false;
    }

    return true;
}